

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  float fVar4;
  uint uVar5;
  undefined4 uVar6;
  uint uVar7;
  size_t end;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar8;
  PrimRefMB *pPVar9;
  MemoryMonitorInterface *pMVar10;
  mvector<embree::PrimRefMB> *pmVar11;
  code *pcVar12;
  ThreadLocal2 *pTVar13;
  Scene *pSVar14;
  InstanceArray *this_00;
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  BBox1f BVar20;
  BBox1f BVar21;
  undefined1 auVar22 [16];
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar23;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar24;
  char cVar25;
  mvector<PrimRefMB> *prims;
  long lVar26;
  size_t sVar27;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var28;
  void *pvVar29;
  undefined8 *puVar30;
  runtime_error *prVar31;
  long lVar32;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar33;
  size_t sVar34;
  float *pfVar35;
  unsigned_long uVar36;
  range<unsigned_long> *prVar37;
  BuildRecord *this_01;
  Split *pSVar38;
  unsigned_long uVar39;
  char *pcVar40;
  size_t sVar41;
  ulong uVar42;
  size_t i_3;
  SetMB *this_02;
  byte bVar43;
  LocalChildListSplit *in_00;
  ulong uVar44;
  ulong uVar45;
  BBox1f *pBVar46;
  size_t i_5;
  Split *pSVar47;
  bool bVar48;
  undefined8 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined8 uVar57;
  undefined1 auVar56 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 local_1e18 [16];
  undefined8 uStack_1e10;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1de8 [16];
  ulong local_1dd8;
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1db8 [16];
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1d98;
  PrimRefVector lprims;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d78;
  PrimInfoMB left;
  anon_class_1_0_00000001 reduction;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_1c48 [16];
  task_group_context context_2;
  BBox1f local_1ba0;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1b98;
  PrimInfoMB right;
  anon_class_24_3_c5d13451 isLeft;
  unsigned_long local_1a58;
  unsigned_long local_1a50;
  vint vSplitPos;
  BuildRecordSplit local_19a8;
  BuildRecordSplit current;
  LocalChildListSplit children;
  NodeRecordMB4D values [16];
  
  children.children.items[0].super_BuildRecord.depth = in->depth;
  if ((this->cfg).maxDepth < children.children.items[0].super_BuildRecord.depth) {
    puVar30 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&children,"depth limit reached",(allocator *)values);
    *puVar30 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar30 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar30 + 2),(string *)&children);
    __cxa_throw(puVar30,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  SetMB::SetMB(&children.children.items[0].super_BuildRecord.prims,&in->prims);
  findFallback((Split *)values,this,&in->prims);
  BuildRecord::BuildRecord(&current.super_BuildRecord,(BuildRecord *)&children);
  current.split.sah = (float)(undefined4)values[0].ref.ptr;
  current.split.dim = values[0].ref.ptr._4_4_;
  current.split.mapping.num = values[0].lbounds.bounds0.lower.field_0._0_8_;
  current.split.mapping.ofs.field_0._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
  current.split.mapping.scale.field_0._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
  current.split.mapping.scale.field_0._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
  uVar39 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if (current.super_BuildRecord.depth == 1) {
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end ==
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin) {
      bVar43 = 0;
      uVar39 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
    }
    else {
      lVar26 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin * 0x50 + 0x40;
      auVar60 = ZEXT816(0xff8000007f800000);
      for (uVar36 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
          uVar36 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
          uVar36 = uVar36 + 1) {
        auVar64._8_8_ = 0;
        auVar64._0_8_ =
             *(ulong *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0.
                               lower.field_0 + lVar26);
        auVar52 = vcmpps_avx(auVar60,auVar64,1);
        auVar54 = vinsertps_avx(auVar60,auVar64,0x50);
        auVar60 = vblendps_avx(auVar64,auVar60,2);
        auVar60 = vblendvps_avx(auVar60,auVar54,auVar52);
        lVar26 = lVar26 + 0x50;
      }
      auVar52 = vmovshdup_avx(auVar60);
      auVar52 = vcmpps_avx(auVar52,ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.
                                                 time_range.upper),1);
      auVar60 = vcmpps_avx(ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.time_range
                                         .lower),auVar60,1);
      auVar60 = vorps_avx(auVar60,auVar52);
      bVar43 = auVar60[0] & 1;
    }
  }
  else {
    bVar43 = 0;
  }
  uVar45 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar39;
  if (((uVar45 <= (this->cfg).maxLeafSize) && ((uint)values[0]._12_4_ < 2)) && (bVar43 == 0)) {
    local_19a8.super_BuildRecord.depth = uVar45 * 8;
    pTVar13 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar13;
      MutexSys::lock(&pTVar13->mutex);
      if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
             ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar56 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar13->alloc0).end = auVar56._0_8_;
      (pTVar13->alloc0).allocBlockSize = auVar56._8_8_;
      (pTVar13->alloc0).bytesUsed = auVar56._16_8_;
      (pTVar13->alloc0).bytesWasted = auVar56._24_8_;
      (pTVar13->alloc0).ptr = (char *)auVar56._0_8_;
      (pTVar13->alloc0).cur = auVar56._8_8_;
      (pTVar13->alloc0).end = auVar56._16_8_;
      (pTVar13->alloc0).allocBlockSize = auVar56._24_8_;
      auVar56 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar13->alloc1).end = auVar56._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar56._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar56._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar56._24_8_;
        (pTVar13->alloc1).ptr = (char *)auVar56._0_8_;
        (pTVar13->alloc1).cur = auVar56._8_8_;
        (pTVar13->alloc1).end = auVar56._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar56._24_8_;
      }
      else {
        (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar13->alloc1).ptr = (char *)auVar56._0_8_;
        (pTVar13->alloc1).cur = auVar56._8_8_;
        (pTVar13->alloc1).end = auVar56._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar56._24_8_;
        (pTVar13->alloc1).end = auVar56._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar56._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar56._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar56._24_8_;
        (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar13->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      children.children.items[0].super_BuildRecord.depth =
           (size_t)&FastAllocator::s_thread_local_allocators_lock;
      children.children.items[0].super_BuildRecord._8_1_ = 1;
      context_2.my_cpu_ctl_env = (uint64_t)pTVar13;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&context_2);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)values);
    }
    sVar41 = local_19a8.super_BuildRecord.depth;
    (alloc.talloc1)->bytesUsed = local_19a8.super_BuildRecord.depth + (alloc.talloc1)->bytesUsed;
    sVar34 = (alloc.talloc1)->cur;
    uVar42 = (ulong)(-(int)sVar34 & 0x1f);
    uVar44 = local_19a8.super_BuildRecord.depth + uVar42 + sVar34;
    (alloc.talloc1)->cur = uVar44;
    if ((alloc.talloc1)->end < uVar44) {
      (alloc.talloc1)->cur = sVar34;
      uVar42 = (alloc.talloc1)->allocBlockSize;
      if (local_19a8.super_BuildRecord.depth * 4 < uVar42 ||
          local_19a8.super_BuildRecord.depth * 4 - uVar42 == 0) {
        children.children.items[0].super_BuildRecord.depth = uVar42;
        pcVar40 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
        (alloc.talloc1)->ptr = pcVar40;
        sVar34 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar34;
        (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
        (alloc.talloc1)->cur = sVar41;
        if (children.children.items[0].super_BuildRecord.depth < sVar41) {
          (alloc.talloc1)->cur = 0;
          children.children.items[0].super_BuildRecord.depth = (alloc.talloc1)->allocBlockSize;
          pcVar40 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
          (alloc.talloc1)->ptr = pcVar40;
          sVar34 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar34;
          (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
          (alloc.talloc1)->cur = sVar41;
          if (children.children.items[0].super_BuildRecord.depth < sVar41) {
            (alloc.talloc1)->cur = 0;
            pcVar40 = (char *)0x0;
            goto LAB_00d09141;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar34;
      }
      else {
        pcVar40 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_19a8);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar42;
      pcVar40 = (alloc.talloc1)->ptr + (uVar44 - local_19a8.super_BuildRecord.depth);
    }
LAB_00d09141:
    uVar42 = 7;
    if (uVar45 < 7) {
      uVar42 = uVar45;
    }
    lVar26 = uVar39 * 10;
    aVar58.m128[2] = -INFINITY;
    aVar58._0_8_ = 0xff800000ff800000;
    aVar58.m128[3] = -INFINITY;
    aVar62.m128[2] = INFINITY;
    aVar62._0_8_ = 0x7f8000007f800000;
    aVar62.m128[3] = INFINITY;
    local_1d78 = aVar62;
    local_1d88 = aVar58;
    for (uVar44 = 0; uVar45 != uVar44; uVar44 = uVar44 + 1) {
      pSVar14 = ((this->createLeaf).bvh)->scene;
      uVar5 = *(uint *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0.
                               lower.field_0 + lVar26 * 8 + 0xc);
      uVar7 = *(uint *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0.
                               upper.field_0 + lVar26 * 8 + 0xc);
      *(uint *)(pcVar40 + uVar44 * 8) = uVar7;
      *(uint *)(pcVar40 + uVar44 * 8 + 4) = uVar5;
      this_00 = (InstanceArray *)(pSVar14->geometries).items[uVar5].ptr;
      if ((*(long *)&(this_00->super_Geometry).field_0x58 != 0) ||
         (*(int *)((this_00->object_ids).super_RawBufferView.ptr_ofs +
                  (this_00->object_ids).super_RawBufferView.stride * (ulong)uVar7) != -1)) {
        InstanceArray::nonlinearBounds
                  ((LBBox3fa *)&children,this_00,(ulong)uVar7,(BBox1f *)values,
                   &(this_00->super_Geometry).time_range,(this_00->super_Geometry).fnumTimeSegments)
        ;
      }
      auVar22[8] = children.children.items[0].super_BuildRecord._8_1_;
      auVar22._0_8_ = children.children.items[0].super_BuildRecord.depth;
      auVar22._9_7_ = children.children.items[0].super_BuildRecord._9_7_;
      aVar62.m128 = (__m128)vminps_avx(aVar62.m128,auVar22);
      aVar58.m128 = (__m128)vmaxps_avx(aVar58.m128,
                                       children.children.items[0].super_BuildRecord.prims.
                                       super_PrimInfoMB.
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                                       bounds0.lower.field_0);
      local_1d78.m128 =
           (__m128)vminps_avx(local_1d78.m128,
                              children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                              super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                              upper.field_0);
      local_1d88.m128 =
           (__m128)vmaxps_avx(local_1d88.m128,
                              children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                              super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                              lower.field_0);
      lVar26 = lVar26 + 10;
    }
    (__return_storage_ptr__->ref).ptr = uVar42 | (ulong)pcVar40 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar62;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar58;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d78;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1d88;
    BVar20.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    BVar20.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
    __return_storage_ptr__->dt = BVar20;
    return __return_storage_ptr__;
  }
  array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL>::array_t
            ((array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL> *)&children);
  children.numChildren = 1;
  local_1dd8 = 1;
  children.numSharedPrimVecs = 1;
  BuildRecordSplit::operator=((BuildRecordSplit *)&children,&current);
  children.sharedPrimVecs.items[0].prims = current.super_BuildRecord.prims.prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_1db8._0_8_;
  local_1db8 = auVar60 << 0x40;
  local_1d78.m128[2] = INFINITY;
  local_1d78._0_8_ = 0x7f8000007f800000;
  local_1d78.m128[3] = INFINITY;
  local_1d88.m128[2] = -INFINITY;
  local_1d88._0_8_ = 0xff800000ff800000;
  local_1d88.m128[3] = -INFINITY;
  do {
    auVar60 = local_1db8;
    prVar37 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.object_range;
    uVar45 = 0;
    sVar34 = 0xffffffffffffffff;
    for (sVar41 = 0; children.numChildren != sVar41; sVar41 = sVar41 + 1) {
      uVar42 = prVar37->_end - prVar37->_begin;
      if ((((this->cfg).maxLeafSize < uVar42) || (1 < *(uint *)((long)(prVar37 + 4) + 0xc))) ||
         (bVar43 != 0)) {
        if (uVar45 < uVar42) {
          sVar34 = sVar41;
          uVar45 = uVar42;
        }
        bVar43 = 0;
      }
      prVar37 = prVar37 + 0xf;
    }
    if (sVar34 == 0xffffffffffffffff) break;
    lVar26 = sVar34 * 0xf0;
    this_01 = &children.children.items[sVar34].super_BuildRecord;
    context_2.my_cpu_ctl_env = current.super_BuildRecord.depth + 1;
    local_19a8.split.sah = INFINITY;
    local_19a8.split.dim = -1;
    local_19a8.split.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_19a8.split.data = 0;
    uVar5 = *(uint *)((long)values + lVar26 + -0x10d4);
    local_19a8.super_BuildRecord.depth = context_2.my_cpu_ctl_env;
    if (3 < uVar5) goto LAB_00d07fb7;
    this_02 = &children.children.items[sVar34].super_BuildRecord.prims;
    switch(uVar5) {
    case 0:
      isLeft.split = (Split *)((long)values + lVar26 + -0x10e0);
      sVar41 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      left.max_time_range.lower = 0.0;
      auVar65._8_4_ = 0x3f800000;
      auVar65._0_8_ = 0x3f8000003f800000;
      auVar65._12_4_ = 0x3f800000;
      uVar49 = vmovlps_avx(auVar65);
      left.max_time_range.upper = (float)uVar49;
      left.time_range.lower = (float)((ulong)uVar49 >> 0x20);
      left.time_range.upper = 0.0;
      end = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.object_range.
            _end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.max_time_range.lower = 0.0;
      right._132_8_ = vmovlps_avx(auVar65);
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = *(undefined4 *)((long)values + lVar26 + -0x10d8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar32 = (long)(1 << (*(byte *)((long)values + lVar26 + -0x10dc) & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar32);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar32 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      sVar27 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                         (*(PrimRefMB **)(*(long *)((long)values + lVar26 + -0x10f0) + 0x20),sVar41,
                          end,(EmptyTy *)local_1c48,&left,&right,&isLeft,&reduction,&reduction2,0x80
                          ,0xc00);
      local_1b98 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                     **)((long)values + lVar26 + -0x10f0);
      uVar45 = *(ulong *)((long)values + lVar26 + -0x10f8);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context_2.field_6,&left);
      auVar50._8_8_ = 0;
      auVar50._0_4_ = local_1ba0.lower;
      auVar50._4_4_ = local_1ba0.upper;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar45;
      auVar54 = vcmpps_avx(auVar50,auVar17,1);
      auVar64 = vinsertps_avx(auVar17,auVar50,0x50);
      auVar52 = vblendps_avx(auVar50,auVar17,2);
      auVar52 = vblendvps_avx(auVar52,auVar64,auVar54);
      local_1ba0 = (BBox1f)vmovlps_avx(auVar52);
      pvVar33 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                  **)((long)values + lVar26 + -0x10f0);
      uVar45 = *(ulong *)((long)values + lVar26 + -0x10f8);
      context_2.padding._40_8_ = sVar41;
      context_2.padding._48_8_ = sVar27;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                (&local_19a8.super_BuildRecord.prims.super_PrimInfoMB,&right);
      auVar51._8_8_ = 0;
      auVar51._0_4_ = local_19a8.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
      auVar51._4_4_ = local_19a8.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar45;
      auVar54 = vcmpps_avx(auVar51,auVar18,1);
      auVar64 = vinsertps_avx(auVar18,auVar51,0x50);
      auVar52 = vblendps_avx(auVar51,auVar18,2);
      auVar52 = vblendvps_avx(auVar52,auVar64,auVar54);
      local_19a8.super_BuildRecord.prims.super_PrimInfoMB.time_range = (BBox1f)vmovlps_avx(auVar52);
      local_19a8.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = sVar27;
      local_19a8.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = end;
      local_19a8.super_BuildRecord.prims.prims = pvVar33;
      break;
    case 1:
      SetMB::deterministic_order(this_02);
      splitFallback(this,this_02,(SetMB *)&context_2.field_6,&local_19a8.super_BuildRecord.prims);
      break;
    case 2:
      time_range1.lower = *(float *)((long)values + lVar26 + -0x10d8);
      time_range0.lower = *(float *)((long)values + lVar26 + -0x10f8);
      time_range1.upper = *(float *)((long)values + lVar26 + -0x10f4);
      pmVar11 = *(mvector<embree::PrimRefMB> **)((long)values + lVar26 + -0x10f0);
      time_range0.upper = time_range1.lower;
      _Var28.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      pMVar10 = (this->heuristicTemporalSplit).device;
      *(long *)((long)_Var28.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x20) = 0;
      pSVar38 = (Split *)children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                         object_range._end;
      uVar39 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      *(MemoryMonitorInterface **)
       _Var28.
       super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = pMVar10;
      *(undefined1 *)
       ((long)_Var28.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 8) = 0;
      *(long *)((long)_Var28.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x10) = 0;
      *(long *)((long)_Var28.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x18) = 0;
      lVar26 = (long)pSVar38 - uVar39;
      pSVar47 = pSVar38;
      if (lVar26 != 0) {
        uVar45 = lVar26 * 0x50;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar45,0);
        if (uVar45 < 0x1c00000) {
          pvVar29 = alignedMalloc(uVar45,0x10);
        }
        else {
          pvVar29 = os_malloc(uVar45,(bool *)((long)_Var28.
                                                  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        *(void **)((long)_Var28.
                         super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         .
                         super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                         ._M_head_impl + 0x20) = pvVar29;
        *(long *)((long)_Var28.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x10) = lVar26;
        *(long *)((long)_Var28.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x18) = lVar26;
        pSVar38 = (Split *)children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._begin;
        pSVar47 = (Split *)children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._end;
      }
      vSplitMask.field_0._8_8_ = &time_range0;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      left.max_time_range.lower = 0.0;
      auVar52._8_4_ = 0x3f800000;
      auVar52._0_8_ = 0x3f8000003f800000;
      auVar52._12_4_ = 0x3f800000;
      uVar49 = vmovlps_avx(auVar52);
      left.max_time_range.upper = (float)uVar49;
      left.time_range.lower = (float)((ulong)uVar49 >> 0x20);
      left.time_range.upper = 0.0;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )_Var28.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims = (PrimRefVector)
               _Var28.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      vSplitMask.field_0._0_8_ = pmVar11;
      if ((ulong)((long)pSVar47 - (long)pSVar38) < 0xc00) {
        isLeft.split = pSVar38;
        isLeft.vSplitPos = (vint *)pSVar47;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&right,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pSVar47;
        vSplitPos.field_0.v[1] = (longlong)pSVar38;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&left,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,(task_group_context *)this_01);
        cVar25 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar25 != '\0') {
          prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar31,"task cancelled");
          __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
      }
      uVar39 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end - children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                       object_range._begin;
      if (right.object_range._end - right.object_range._begin != uVar39) {
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             &time_range0;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       (lprims->items,0,uVar39,0x400,(anon_class_8_1_41ce32a5 *)&left);
      }
      auVar15._4_4_ = time_range0.upper;
      auVar15._0_4_ = time_range0.lower;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&left,&right);
      auVar53._4_4_ = left.time_range.upper;
      auVar53._0_4_ = left.time_range.lower;
      auVar53._8_8_ = 0;
      auVar15._8_8_ = 0;
      auVar54 = vcmpps_avx(auVar53,auVar15,1);
      auVar64 = vinsertps_avx(auVar15,auVar53,0x50);
      auVar52 = vblendps_avx(auVar53,auVar15,2);
      auVar52 = vblendvps_avx(auVar52,auVar64,auVar54);
      uVar49 = vmovlps_avx(auVar52);
      left.time_range.lower = (float)uVar49;
      left.time_range.upper = (float)((ulong)uVar49 >> 0x20);
      SetMB::operator=((SetMB *)&context_2.field_6,(SetMB *)&left);
      uVar39 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      left.max_time_range.lower = 0.0;
      auVar54._8_4_ = 0x3f800000;
      auVar54._0_8_ = 0x3f8000003f800000;
      auVar54._12_4_ = 0x3f800000;
      uVar49 = vmovlps_avx(auVar54);
      left.max_time_range.upper = (float)uVar49;
      left.time_range.lower = (float)((ulong)uVar49 >> 0x20);
      left.time_range.upper = 0.0;
      pcVar12 = (code *)children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                        object_range._end;
      _reduction2 = pmVar11;
      if ((long)pcVar12 - uVar39 < 0xc00) {
        vSplitPos.field_0.v[0] = uVar39;
        vSplitPos.field_0.v[1] = (longlong)pcVar12;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&isLeft,(anon_class_24_3_35f68c7c *)&reduction2,
                   (range<unsigned_long> *)&vSplitPos);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&vSplitPos,(context_traits)0x4,CUSTOM_CTX);
        local_1c48._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1c48._8_8_ = &reduction2;
        _reduction = pcVar12;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft,(d1 *)&reduction,
                   (blocked_range<unsigned_long> *)&left,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1c48,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,(task_group_context *)this_01);
        cVar25 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar25 != '\0') {
          prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar31,"task cancelled");
          __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos);
      }
      lVar26 = local_1a50 - local_1a58;
      local_1a58 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.
                   object_range._begin;
      local_1a50 = lVar26 + local_1a58;
      uVar39 = children.children.items[sVar34].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      if (lVar26 != uVar39 - local_1a58) {
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             &time_range1;
        local_1a50 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::InstanceArray>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (pmVar11->items,local_1a58,uVar39,0x400,
                                (anon_class_8_1_41ce32a6 *)&left);
      }
      auVar19._4_4_ = time_range1.upper;
      auVar19._0_4_ = time_range1.lower;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&left,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft);
      auVar55._4_4_ = left.time_range.upper;
      auVar55._0_4_ = left.time_range.lower;
      auVar55._8_8_ = 0;
      auVar19._8_8_ = 0;
      auVar54 = vcmpps_avx(auVar55,auVar19,1);
      auVar64 = vinsertps_avx(auVar19,auVar55,0x50);
      auVar52 = vblendps_avx(auVar55,auVar19,2);
      auVar52 = vblendvps_avx(auVar52,auVar64,auVar54);
      uVar49 = vmovlps_avx(auVar52);
      left.time_range.lower = (float)uVar49;
      left.time_range.upper = (float)((ulong)uVar49 >> 0x20);
      SetMB::operator=(&local_19a8.super_BuildRecord.prims,(SetMB *)&left);
      bVar48 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      goto LAB_00d07fc7;
    case 3:
      SetMB::deterministic_order(this_02);
      splitByGeometry(this,this_02,(SetMB *)&context_2.field_6,&local_19a8.super_BuildRecord.prims);
    }
LAB_00d07fb7:
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    bVar48 = false;
LAB_00d07fc7:
    findFallback((Split *)&left,this,(SetMB *)&context_2.field_6);
    findFallback((Split *)&left,this,&local_19a8.super_BuildRecord.prims);
    sVar41 = children.numSharedPrimVecs;
    local_19a8.split.data =
         (uint)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
               m128[3];
    local_19a8.split.field_2 =
         (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
         [2];
    local_19a8.split.sah =
         (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
                ._0_4_;
    local_19a8.split.dim =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_;
    local_19a8.split.mapping.num =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[0]);
    local_19a8.split.mapping.ofs.field_0._0_8_ =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[0]);
    local_19a8.split.mapping.ofs.field_0._8_8_ =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[2]);
    local_19a8.split.mapping.scale.field_0._0_8_ =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[0]);
    local_19a8.split.mapping.scale.field_0._8_8_ =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                  field_0.m128[2]);
    local_1d98._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar8 = children.primvecs.items[sVar34];
    if (local_1b98 == pSVar8->prims) {
      pSVar8->refCount = pSVar8->refCount + 1;
      pvVar33 = local_1b98;
    }
    else {
      pSVar23 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar24 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar24->prims = local_1b98;
      children.sharedPrimVecs.items[sVar41].refCount = 1;
      children.primvecs.items[sVar34] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar23->prims;
      pvVar33 = pSVar8->prims;
    }
    sVar34 = children.numSharedPrimVecs;
    if (local_19a8.super_BuildRecord.prims.prims == pvVar33) {
      children.primvecs.items[children.numChildren] = pSVar8;
      sVar34 = pSVar8->refCount;
      pSVar8->refCount = sVar34 + 1;
    }
    else {
      pSVar23 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar24 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar24->prims = local_19a8.super_BuildRecord.prims.prims;
      children.sharedPrimVecs.items[sVar34].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar23->prims;
      sVar34 = pSVar8->refCount - 1;
    }
    pSVar8->refCount = sVar34;
    if (sVar34 == 0) {
      pvVar33 = pSVar8->prims;
      if (pvVar33 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar34 = pvVar33->size_alloced;
        pPVar9 = pvVar33->items;
        if (pPVar9 != (PrimRefMB *)0x0) {
          if (sVar34 * 0x50 < 0x1c00000) {
            alignedFree(pPVar9);
          }
          else {
            os_free(pPVar9,sVar34 * 0x50,(pvVar33->alloc).hugepages);
          }
        }
        if (sVar34 != 0) {
          pMVar10 = (pvVar33->alloc).device;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar34 * -0x50,1);
        }
        pvVar33->size_active = 0;
        pvVar33->size_alloced = 0;
        pvVar33->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar33);
    }
    local_1d98._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecordSplit::operator=((BuildRecordSplit *)this_01,(BuildRecordSplit *)&context_2);
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[children.numChildren].super_BuildRecord,
               &local_19a8);
    local_1db8._1_7_ = local_1db8._1_7_;
    local_1db8[0] = local_1db8[0] | bVar48;
    local_1db8._8_8_ = auVar60._8_8_;
    children.numChildren = children.numChildren + 1;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1d98);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector);
  } while (children.numChildren < (this->cfg).branchingFactor);
  in_00 = &children;
  pfVar35 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  sVar34 = children.numChildren;
  while( true ) {
    auVar60 = local_1db8;
    bVar48 = sVar34 == 0;
    sVar34 = sVar34 - 1;
    if (bVar48) break;
    auVar52 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                         ZEXT416((uint)((BBox1f *)(pfVar35 + -1))->lower),1);
    auVar54 = vcmpps_avx(ZEXT416((uint)*pfVar35),
                         ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
    auVar52 = vorps_avx(auVar52,auVar54);
    local_1db8._1_7_ = local_1db8._1_7_;
    local_1db8[0] = local_1db8[0] | auVar52[0];
    local_1db8._8_8_ = auVar60._8_8_;
    pfVar35 = pfVar35 + 0x3c;
  }
  if ((local_1db8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0x1c0;
    pTVar13 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
      local_19a8.super_BuildRecord._8_1_ = 1;
      local_19a8.super_BuildRecord.depth = (size_t)pTVar13;
      MutexSys::lock(&pTVar13->mutex);
      if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
             ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar56 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar13->alloc0).end = auVar56._0_8_;
      (pTVar13->alloc0).allocBlockSize = auVar56._8_8_;
      (pTVar13->alloc0).bytesUsed = auVar56._16_8_;
      (pTVar13->alloc0).bytesWasted = auVar56._24_8_;
      (pTVar13->alloc0).ptr = (char *)auVar56._0_8_;
      (pTVar13->alloc0).cur = auVar56._8_8_;
      (pTVar13->alloc0).end = auVar56._16_8_;
      (pTVar13->alloc0).allocBlockSize = auVar56._24_8_;
      auVar56 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar13->alloc1).end = auVar56._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar56._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar56._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar56._24_8_;
        (pTVar13->alloc1).ptr = (char *)auVar56._0_8_;
        (pTVar13->alloc1).cur = auVar56._8_8_;
        (pTVar13->alloc1).end = auVar56._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar56._24_8_;
      }
      else {
        (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar13->alloc1).ptr = (char *)auVar56._0_8_;
        (pTVar13->alloc1).cur = auVar56._8_8_;
        (pTVar13->alloc1).end = auVar56._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar56._24_8_;
        (pTVar13->alloc1).end = auVar56._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar56._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar56._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar56._24_8_;
        (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar13->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      context_2.my_cpu_ctl_env = (uint64_t)&FastAllocator::s_thread_local_allocators_lock;
      context_2.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i._0_1_ = 1;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar13;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&left);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&context_2);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_19a8);
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar34 = (alloc.talloc0)->cur;
    uVar45 = (ulong)(-(int)sVar34 & 0x1f);
    uVar42 = sVar34 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar45;
    (alloc.talloc0)->cur = uVar42;
    if ((alloc.talloc0)->end < uVar42) {
      (alloc.talloc0)->cur = sVar34;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar40 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
        pcVar40 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
        (alloc.talloc0)->ptr = pcVar40;
        sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar34;
        (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if (context_2.my_cpu_ctl_env <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
          pcVar40 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
          (alloc.talloc0)->ptr = pcVar40;
          sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar34;
          (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if (context_2.my_cpu_ctl_env <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar40 = (char *)0x0;
            goto LAB_00d08d2d;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar34;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar45;
      pcVar40 = (alloc.talloc0)->ptr +
                (uVar42 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00d08d2d:
    pcVar40[0xc0] = '\0';
    pcVar40[0xc1] = '\0';
    pcVar40[0xc2] = -0x80;
    pcVar40[0xc3] = '\x7f';
    pcVar40[0xc4] = '\0';
    pcVar40[0xc5] = '\0';
    pcVar40[0xc6] = -0x80;
    pcVar40[199] = '\x7f';
    pcVar40[200] = '\0';
    pcVar40[0xc9] = '\0';
    pcVar40[0xca] = -0x80;
    pcVar40[0xcb] = '\x7f';
    pcVar40[0xcc] = '\0';
    pcVar40[0xcd] = '\0';
    pcVar40[0xce] = -0x80;
    pcVar40[0xcf] = '\x7f';
    pcVar40[0xd0] = '\0';
    pcVar40[0xd1] = '\0';
    pcVar40[0xd2] = -0x80;
    pcVar40[0xd3] = '\x7f';
    pcVar40[0xd4] = '\0';
    pcVar40[0xd5] = '\0';
    pcVar40[0xd6] = -0x80;
    pcVar40[0xd7] = '\x7f';
    pcVar40[0xd8] = '\0';
    pcVar40[0xd9] = '\0';
    pcVar40[0xda] = -0x80;
    pcVar40[0xdb] = '\x7f';
    pcVar40[0xdc] = '\0';
    pcVar40[0xdd] = '\0';
    pcVar40[0xde] = -0x80;
    pcVar40[0xdf] = '\x7f';
    pcVar40[0x80] = '\0';
    pcVar40[0x81] = '\0';
    pcVar40[0x82] = -0x80;
    pcVar40[0x83] = '\x7f';
    pcVar40[0x84] = '\0';
    pcVar40[0x85] = '\0';
    pcVar40[0x86] = -0x80;
    pcVar40[0x87] = '\x7f';
    pcVar40[0x88] = '\0';
    pcVar40[0x89] = '\0';
    pcVar40[0x8a] = -0x80;
    pcVar40[0x8b] = '\x7f';
    pcVar40[0x8c] = '\0';
    pcVar40[0x8d] = '\0';
    pcVar40[0x8e] = -0x80;
    pcVar40[0x8f] = '\x7f';
    pcVar40[0x90] = '\0';
    pcVar40[0x91] = '\0';
    pcVar40[0x92] = -0x80;
    pcVar40[0x93] = '\x7f';
    pcVar40[0x94] = '\0';
    pcVar40[0x95] = '\0';
    pcVar40[0x96] = -0x80;
    pcVar40[0x97] = '\x7f';
    pcVar40[0x98] = '\0';
    pcVar40[0x99] = '\0';
    pcVar40[0x9a] = -0x80;
    pcVar40[0x9b] = '\x7f';
    pcVar40[0x9c] = '\0';
    pcVar40[0x9d] = '\0';
    pcVar40[0x9e] = -0x80;
    pcVar40[0x9f] = '\x7f';
    pcVar40[0x40] = '\0';
    pcVar40[0x41] = '\0';
    pcVar40[0x42] = -0x80;
    pcVar40[0x43] = '\x7f';
    pcVar40[0x44] = '\0';
    pcVar40[0x45] = '\0';
    pcVar40[0x46] = -0x80;
    pcVar40[0x47] = '\x7f';
    pcVar40[0x48] = '\0';
    pcVar40[0x49] = '\0';
    pcVar40[0x4a] = -0x80;
    pcVar40[0x4b] = '\x7f';
    pcVar40[0x4c] = '\0';
    pcVar40[0x4d] = '\0';
    pcVar40[0x4e] = -0x80;
    pcVar40[0x4f] = '\x7f';
    pcVar40[0x50] = '\0';
    pcVar40[0x51] = '\0';
    pcVar40[0x52] = -0x80;
    pcVar40[0x53] = '\x7f';
    pcVar40[0x54] = '\0';
    pcVar40[0x55] = '\0';
    pcVar40[0x56] = -0x80;
    pcVar40[0x57] = '\x7f';
    pcVar40[0x58] = '\0';
    pcVar40[0x59] = '\0';
    pcVar40[0x5a] = -0x80;
    pcVar40[0x5b] = '\x7f';
    pcVar40[0x5c] = '\0';
    pcVar40[0x5d] = '\0';
    pcVar40[0x5e] = -0x80;
    pcVar40[0x5f] = '\x7f';
    pcVar40[0xe0] = '\0';
    pcVar40[0xe1] = '\0';
    pcVar40[0xe2] = -0x80;
    pcVar40[0xe3] = -1;
    pcVar40[0xe4] = '\0';
    pcVar40[0xe5] = '\0';
    pcVar40[0xe6] = -0x80;
    pcVar40[0xe7] = -1;
    pcVar40[0xe8] = '\0';
    pcVar40[0xe9] = '\0';
    pcVar40[0xea] = -0x80;
    pcVar40[0xeb] = -1;
    pcVar40[0xec] = '\0';
    pcVar40[0xed] = '\0';
    pcVar40[0xee] = -0x80;
    pcVar40[0xef] = -1;
    pcVar40[0xf0] = '\0';
    pcVar40[0xf1] = '\0';
    pcVar40[0xf2] = -0x80;
    pcVar40[0xf3] = -1;
    pcVar40[0xf4] = '\0';
    pcVar40[0xf5] = '\0';
    pcVar40[0xf6] = -0x80;
    pcVar40[0xf7] = -1;
    pcVar40[0xf8] = '\0';
    pcVar40[0xf9] = '\0';
    pcVar40[0xfa] = -0x80;
    pcVar40[0xfb] = -1;
    pcVar40[0xfc] = '\0';
    pcVar40[0xfd] = '\0';
    pcVar40[0xfe] = -0x80;
    pcVar40[0xff] = -1;
    pcVar40[0xa0] = '\0';
    pcVar40[0xa1] = '\0';
    pcVar40[0xa2] = -0x80;
    pcVar40[0xa3] = -1;
    pcVar40[0xa4] = '\0';
    pcVar40[0xa5] = '\0';
    pcVar40[0xa6] = -0x80;
    pcVar40[0xa7] = -1;
    pcVar40[0xa8] = '\0';
    pcVar40[0xa9] = '\0';
    pcVar40[0xaa] = -0x80;
    pcVar40[0xab] = -1;
    pcVar40[0xac] = '\0';
    pcVar40[0xad] = '\0';
    pcVar40[0xae] = -0x80;
    pcVar40[0xaf] = -1;
    pcVar40[0xb0] = '\0';
    pcVar40[0xb1] = '\0';
    pcVar40[0xb2] = -0x80;
    pcVar40[0xb3] = -1;
    pcVar40[0xb4] = '\0';
    pcVar40[0xb5] = '\0';
    pcVar40[0xb6] = -0x80;
    pcVar40[0xb7] = -1;
    pcVar40[0xb8] = '\0';
    pcVar40[0xb9] = '\0';
    pcVar40[0xba] = -0x80;
    pcVar40[0xbb] = -1;
    pcVar40[0xbc] = '\0';
    pcVar40[0xbd] = '\0';
    pcVar40[0xbe] = -0x80;
    pcVar40[0xbf] = -1;
    pcVar40[0x60] = '\0';
    pcVar40[0x61] = '\0';
    pcVar40[0x62] = -0x80;
    pcVar40[99] = -1;
    pcVar40[100] = '\0';
    pcVar40[0x65] = '\0';
    pcVar40[0x66] = -0x80;
    pcVar40[0x67] = -1;
    pcVar40[0x68] = '\0';
    pcVar40[0x69] = '\0';
    pcVar40[0x6a] = -0x80;
    pcVar40[0x6b] = -1;
    pcVar40[0x6c] = '\0';
    pcVar40[0x6d] = '\0';
    pcVar40[0x6e] = -0x80;
    pcVar40[0x6f] = -1;
    pcVar40[0x70] = '\0';
    pcVar40[0x71] = '\0';
    pcVar40[0x72] = -0x80;
    pcVar40[0x73] = -1;
    pcVar40[0x74] = '\0';
    pcVar40[0x75] = '\0';
    pcVar40[0x76] = -0x80;
    pcVar40[0x77] = -1;
    pcVar40[0x78] = '\0';
    pcVar40[0x79] = '\0';
    pcVar40[0x7a] = -0x80;
    pcVar40[0x7b] = -1;
    pcVar40[0x7c] = '\0';
    pcVar40[0x7d] = '\0';
    pcVar40[0x7e] = -0x80;
    pcVar40[0x7f] = -1;
    auVar56 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar40 + 0x100) = auVar56;
    *(undefined1 (*) [32])(pcVar40 + 0x120) = auVar56;
    auVar56 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar40 + 0x140) = auVar56;
    *(undefined1 (*) [32])(pcVar40 + 0x160) = auVar56;
    *(undefined1 (*) [32])(pcVar40 + 0x180) = auVar56;
    *(undefined1 (*) [32])(pcVar40 + 0x1a0) = auVar56;
    for (lVar26 = 0; lVar26 != 8; lVar26 = lVar26 + 1) {
      pcVar3 = pcVar40 + lVar26 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
    }
    goto LAB_00d08db2;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x200;
  pTVar13 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
    local_19a8.super_BuildRecord._8_1_ = 1;
    local_19a8.super_BuildRecord.depth = (size_t)pTVar13;
    MutexSys::lock(&pTVar13->mutex);
    if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
           ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar56 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar13->alloc0).end = auVar56._0_8_;
    (pTVar13->alloc0).allocBlockSize = auVar56._8_8_;
    (pTVar13->alloc0).bytesUsed = auVar56._16_8_;
    (pTVar13->alloc0).bytesWasted = auVar56._24_8_;
    (pTVar13->alloc0).ptr = (char *)auVar56._0_8_;
    (pTVar13->alloc0).cur = auVar56._8_8_;
    (pTVar13->alloc0).end = auVar56._16_8_;
    (pTVar13->alloc0).allocBlockSize = auVar56._24_8_;
    auVar56 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar13->alloc1).end = auVar56._0_8_;
      (pTVar13->alloc1).allocBlockSize = auVar56._8_8_;
      (pTVar13->alloc1).bytesUsed = auVar56._16_8_;
      (pTVar13->alloc1).bytesWasted = auVar56._24_8_;
      (pTVar13->alloc1).ptr = (char *)auVar56._0_8_;
      (pTVar13->alloc1).cur = auVar56._8_8_;
      (pTVar13->alloc1).end = auVar56._16_8_;
      (pTVar13->alloc1).allocBlockSize = auVar56._24_8_;
    }
    else {
      (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar13->alloc1).ptr = (char *)auVar56._0_8_;
      (pTVar13->alloc1).cur = auVar56._8_8_;
      (pTVar13->alloc1).end = auVar56._16_8_;
      (pTVar13->alloc1).allocBlockSize = auVar56._24_8_;
      (pTVar13->alloc1).end = auVar56._0_8_;
      (pTVar13->alloc1).allocBlockSize = auVar56._8_8_;
      (pTVar13->alloc1).bytesUsed = auVar56._16_8_;
      (pTVar13->alloc1).bytesWasted = auVar56._24_8_;
      (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar13->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    context_2.my_cpu_ctl_env = (uint64_t)&FastAllocator::s_thread_local_allocators_lock;
    context_2.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i._0_1_ = 1;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar13;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&left);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&context_2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_19a8);
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar34 = (alloc.talloc0)->cur;
  uVar45 = (ulong)(-(int)sVar34 & 0x1f);
  uVar42 = sVar34 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar45;
  (alloc.talloc0)->cur = uVar42;
  if ((alloc.talloc0)->end < uVar42) {
    (alloc.talloc0)->cur = sVar34;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar40 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
      pcVar40 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
      (alloc.talloc0)->ptr = pcVar40;
      sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar34;
      (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if (context_2.my_cpu_ctl_env <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
        pcVar40 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
        (alloc.talloc0)->ptr = pcVar40;
        sVar34 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar34;
        (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if (context_2.my_cpu_ctl_env <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar40 = (char *)0x0;
          goto LAB_00d08be9;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar34;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar45;
    pcVar40 = (alloc.talloc0)->ptr +
              (uVar42 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00d08be9:
  pcVar40[0x1c0] = '\0';
  pcVar40[0x1c1] = '\0';
  pcVar40[0x1c2] = -0x80;
  pcVar40[0x1c3] = '\x7f';
  pcVar40[0x1c4] = '\0';
  pcVar40[0x1c5] = '\0';
  pcVar40[0x1c6] = -0x80;
  pcVar40[0x1c7] = '\x7f';
  pcVar40[0x1c8] = '\0';
  pcVar40[0x1c9] = '\0';
  pcVar40[0x1ca] = -0x80;
  pcVar40[0x1cb] = '\x7f';
  pcVar40[0x1cc] = '\0';
  pcVar40[0x1cd] = '\0';
  pcVar40[0x1ce] = -0x80;
  pcVar40[0x1cf] = '\x7f';
  pcVar40[0x1d0] = '\0';
  pcVar40[0x1d1] = '\0';
  pcVar40[0x1d2] = -0x80;
  pcVar40[0x1d3] = '\x7f';
  pcVar40[0x1d4] = '\0';
  pcVar40[0x1d5] = '\0';
  pcVar40[0x1d6] = -0x80;
  pcVar40[0x1d7] = '\x7f';
  pcVar40[0x1d8] = '\0';
  pcVar40[0x1d9] = '\0';
  pcVar40[0x1da] = -0x80;
  pcVar40[0x1db] = '\x7f';
  pcVar40[0x1dc] = '\0';
  pcVar40[0x1dd] = '\0';
  pcVar40[0x1de] = -0x80;
  pcVar40[0x1df] = '\x7f';
  pcVar40[0x1e0] = '\0';
  pcVar40[0x1e1] = '\0';
  pcVar40[0x1e2] = -0x80;
  pcVar40[0x1e3] = -1;
  pcVar40[0x1e4] = '\0';
  pcVar40[0x1e5] = '\0';
  pcVar40[0x1e6] = -0x80;
  pcVar40[0x1e7] = -1;
  pcVar40[0x1e8] = '\0';
  pcVar40[0x1e9] = '\0';
  pcVar40[0x1ea] = -0x80;
  pcVar40[0x1eb] = -1;
  pcVar40[0x1ec] = '\0';
  pcVar40[0x1ed] = '\0';
  pcVar40[0x1ee] = -0x80;
  pcVar40[0x1ef] = -1;
  pcVar40[0x1f0] = '\0';
  pcVar40[0x1f1] = '\0';
  pcVar40[0x1f2] = -0x80;
  pcVar40[499] = -1;
  pcVar40[500] = '\0';
  pcVar40[0x1f5] = '\0';
  pcVar40[0x1f6] = -0x80;
  pcVar40[0x1f7] = -1;
  pcVar40[0x1f8] = '\0';
  pcVar40[0x1f9] = '\0';
  pcVar40[0x1fa] = -0x80;
  pcVar40[0x1fb] = -1;
  pcVar40[0x1fc] = '\0';
  pcVar40[0x1fd] = '\0';
  pcVar40[0x1fe] = -0x80;
  pcVar40[0x1ff] = -1;
  pcVar40[0xc0] = '\0';
  pcVar40[0xc1] = '\0';
  pcVar40[0xc2] = -0x80;
  pcVar40[0xc3] = '\x7f';
  pcVar40[0xc4] = '\0';
  pcVar40[0xc5] = '\0';
  pcVar40[0xc6] = -0x80;
  pcVar40[199] = '\x7f';
  pcVar40[200] = '\0';
  pcVar40[0xc9] = '\0';
  pcVar40[0xca] = -0x80;
  pcVar40[0xcb] = '\x7f';
  pcVar40[0xcc] = '\0';
  pcVar40[0xcd] = '\0';
  pcVar40[0xce] = -0x80;
  pcVar40[0xcf] = '\x7f';
  pcVar40[0xd0] = '\0';
  pcVar40[0xd1] = '\0';
  pcVar40[0xd2] = -0x80;
  pcVar40[0xd3] = '\x7f';
  pcVar40[0xd4] = '\0';
  pcVar40[0xd5] = '\0';
  pcVar40[0xd6] = -0x80;
  pcVar40[0xd7] = '\x7f';
  pcVar40[0xd8] = '\0';
  pcVar40[0xd9] = '\0';
  pcVar40[0xda] = -0x80;
  pcVar40[0xdb] = '\x7f';
  pcVar40[0xdc] = '\0';
  pcVar40[0xdd] = '\0';
  pcVar40[0xde] = -0x80;
  pcVar40[0xdf] = '\x7f';
  pcVar40[0x80] = '\0';
  pcVar40[0x81] = '\0';
  pcVar40[0x82] = -0x80;
  pcVar40[0x83] = '\x7f';
  pcVar40[0x84] = '\0';
  pcVar40[0x85] = '\0';
  pcVar40[0x86] = -0x80;
  pcVar40[0x87] = '\x7f';
  pcVar40[0x88] = '\0';
  pcVar40[0x89] = '\0';
  pcVar40[0x8a] = -0x80;
  pcVar40[0x8b] = '\x7f';
  pcVar40[0x8c] = '\0';
  pcVar40[0x8d] = '\0';
  pcVar40[0x8e] = -0x80;
  pcVar40[0x8f] = '\x7f';
  pcVar40[0x90] = '\0';
  pcVar40[0x91] = '\0';
  pcVar40[0x92] = -0x80;
  pcVar40[0x93] = '\x7f';
  pcVar40[0x94] = '\0';
  pcVar40[0x95] = '\0';
  pcVar40[0x96] = -0x80;
  pcVar40[0x97] = '\x7f';
  pcVar40[0x98] = '\0';
  pcVar40[0x99] = '\0';
  pcVar40[0x9a] = -0x80;
  pcVar40[0x9b] = '\x7f';
  pcVar40[0x9c] = '\0';
  pcVar40[0x9d] = '\0';
  pcVar40[0x9e] = -0x80;
  pcVar40[0x9f] = '\x7f';
  pcVar40[0x40] = '\0';
  pcVar40[0x41] = '\0';
  pcVar40[0x42] = -0x80;
  pcVar40[0x43] = '\x7f';
  pcVar40[0x44] = '\0';
  pcVar40[0x45] = '\0';
  pcVar40[0x46] = -0x80;
  pcVar40[0x47] = '\x7f';
  pcVar40[0x48] = '\0';
  pcVar40[0x49] = '\0';
  pcVar40[0x4a] = -0x80;
  pcVar40[0x4b] = '\x7f';
  pcVar40[0x4c] = '\0';
  pcVar40[0x4d] = '\0';
  pcVar40[0x4e] = -0x80;
  pcVar40[0x4f] = '\x7f';
  pcVar40[0x50] = '\0';
  pcVar40[0x51] = '\0';
  pcVar40[0x52] = -0x80;
  pcVar40[0x53] = '\x7f';
  pcVar40[0x54] = '\0';
  pcVar40[0x55] = '\0';
  pcVar40[0x56] = -0x80;
  pcVar40[0x57] = '\x7f';
  pcVar40[0x58] = '\0';
  pcVar40[0x59] = '\0';
  pcVar40[0x5a] = -0x80;
  pcVar40[0x5b] = '\x7f';
  pcVar40[0x5c] = '\0';
  pcVar40[0x5d] = '\0';
  pcVar40[0x5e] = -0x80;
  pcVar40[0x5f] = '\x7f';
  pcVar40[0xe0] = '\0';
  pcVar40[0xe1] = '\0';
  pcVar40[0xe2] = -0x80;
  pcVar40[0xe3] = -1;
  pcVar40[0xe4] = '\0';
  pcVar40[0xe5] = '\0';
  pcVar40[0xe6] = -0x80;
  pcVar40[0xe7] = -1;
  pcVar40[0xe8] = '\0';
  pcVar40[0xe9] = '\0';
  pcVar40[0xea] = -0x80;
  pcVar40[0xeb] = -1;
  pcVar40[0xec] = '\0';
  pcVar40[0xed] = '\0';
  pcVar40[0xee] = -0x80;
  pcVar40[0xef] = -1;
  pcVar40[0xf0] = '\0';
  pcVar40[0xf1] = '\0';
  pcVar40[0xf2] = -0x80;
  pcVar40[0xf3] = -1;
  pcVar40[0xf4] = '\0';
  pcVar40[0xf5] = '\0';
  pcVar40[0xf6] = -0x80;
  pcVar40[0xf7] = -1;
  pcVar40[0xf8] = '\0';
  pcVar40[0xf9] = '\0';
  pcVar40[0xfa] = -0x80;
  pcVar40[0xfb] = -1;
  pcVar40[0xfc] = '\0';
  pcVar40[0xfd] = '\0';
  pcVar40[0xfe] = -0x80;
  pcVar40[0xff] = -1;
  pcVar40[0xa0] = '\0';
  pcVar40[0xa1] = '\0';
  pcVar40[0xa2] = -0x80;
  pcVar40[0xa3] = -1;
  pcVar40[0xa4] = '\0';
  pcVar40[0xa5] = '\0';
  pcVar40[0xa6] = -0x80;
  pcVar40[0xa7] = -1;
  pcVar40[0xa8] = '\0';
  pcVar40[0xa9] = '\0';
  pcVar40[0xaa] = -0x80;
  pcVar40[0xab] = -1;
  pcVar40[0xac] = '\0';
  pcVar40[0xad] = '\0';
  pcVar40[0xae] = -0x80;
  pcVar40[0xaf] = -1;
  pcVar40[0xb0] = '\0';
  pcVar40[0xb1] = '\0';
  pcVar40[0xb2] = -0x80;
  pcVar40[0xb3] = -1;
  pcVar40[0xb4] = '\0';
  pcVar40[0xb5] = '\0';
  pcVar40[0xb6] = -0x80;
  pcVar40[0xb7] = -1;
  pcVar40[0xb8] = '\0';
  pcVar40[0xb9] = '\0';
  pcVar40[0xba] = -0x80;
  pcVar40[0xbb] = -1;
  pcVar40[0xbc] = '\0';
  pcVar40[0xbd] = '\0';
  pcVar40[0xbe] = -0x80;
  pcVar40[0xbf] = -1;
  pcVar40[0x60] = '\0';
  pcVar40[0x61] = '\0';
  pcVar40[0x62] = -0x80;
  pcVar40[99] = -1;
  pcVar40[100] = '\0';
  pcVar40[0x65] = '\0';
  pcVar40[0x66] = -0x80;
  pcVar40[0x67] = -1;
  pcVar40[0x68] = '\0';
  pcVar40[0x69] = '\0';
  pcVar40[0x6a] = -0x80;
  pcVar40[0x6b] = -1;
  pcVar40[0x6c] = '\0';
  pcVar40[0x6d] = '\0';
  pcVar40[0x6e] = -0x80;
  pcVar40[0x6f] = -1;
  pcVar40[0x70] = '\0';
  pcVar40[0x71] = '\0';
  pcVar40[0x72] = -0x80;
  pcVar40[0x73] = -1;
  pcVar40[0x74] = '\0';
  pcVar40[0x75] = '\0';
  pcVar40[0x76] = -0x80;
  pcVar40[0x77] = -1;
  pcVar40[0x78] = '\0';
  pcVar40[0x79] = '\0';
  pcVar40[0x7a] = -0x80;
  pcVar40[0x7b] = -1;
  pcVar40[0x7c] = '\0';
  pcVar40[0x7d] = '\0';
  pcVar40[0x7e] = -0x80;
  pcVar40[0x7f] = -1;
  auVar56 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar40 + 0x100) = auVar56;
  *(undefined1 (*) [32])(pcVar40 + 0x120) = auVar56;
  auVar56 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar40 + 0x140) = auVar56;
  *(undefined1 (*) [32])(pcVar40 + 0x160) = auVar56;
  *(undefined1 (*) [32])(pcVar40 + 0x180) = auVar56;
  *(undefined1 (*) [32])(pcVar40 + 0x1a0) = auVar56;
  local_1dd8 = 6;
  for (lVar26 = 0; lVar26 != 8; lVar26 = lVar26 + 1) {
    pcVar3 = pcVar40 + lVar26 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
LAB_00d08db2:
  local_1dd8 = local_1dd8 | (ulong)pcVar40;
  pBVar46 = &values[0].dt;
  uStack_1e10._0_4_ = 0xff800000;
  local_1e18._0_8_ = (task_group_context *)0xff800000ff800000;
  uStack_1e10._4_4_ = 0xff800000;
  local_1de8._8_4_ = 0x7f800000;
  local_1de8._0_8_ = 0x7f8000007f800000;
  local_1de8._12_4_ = 0x7f800000;
  for (uVar45 = 0; uVar45 < children.numChildren; uVar45 = uVar45 + 1) {
    createLargeLeaf((NodeRecordMB4D *)&context_2,this,(BuildRecord *)in_00,alloc);
    (((NodeRecordMB4D *)(pBVar46 + -10))->ref).ptr = context_2.my_cpu_ctl_env;
    (((LBBox3fa *)(pBVar46 + -8))->bounds0).lower.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)context_2._16_16_;
    *(intrusive_list_node *)(pBVar46 + -6) = context_2.my_node;
    (((BBox<embree::Vec3fa> *)(pBVar46 + -4))->lower).field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)context_2._48_16_;
    ((Vec3fa *)(pBVar46 + -2))->field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)context_2._64_16_;
    *pBVar46 = (BBox1f)context_2.padding._8_8_;
    local_1de8 = vminps_avx(local_1de8,(undefined1  [16])context_2._16_16_);
    local_1e18 = vmaxps_avx(local_1e18,(undefined1  [16])context_2.my_node);
    local_1d78.m128 = (__m128)vminps_avx(local_1d78.m128,(undefined1  [16])context_2._48_16_);
    local_1d88.m128 = (__m128)vmaxps_avx(local_1d88.m128,(undefined1  [16])context_2._64_16_);
    in_00 = (LocalChildListSplit *)((in_00->children).items + 1);
    pBVar46 = pBVar46 + 0xc;
  }
  uVar45 = (ulong)pcVar40 & 0xfffffffffffffff0;
  if (((uint)local_1dd8 & 0xf) == 1) {
    pfVar35 = &values[0].dt.upper;
    auVar61._8_4_ = 0x7f7fffff;
    auVar61._0_8_ = 0x7f7fffff7f7fffff;
    auVar61._12_4_ = 0x7f7fffff;
    auVar66._8_4_ = 0xff7fffff;
    auVar66._0_8_ = 0xff7fffffff7fffff;
    auVar66._12_4_ = 0xff7fffff;
    auVar68._8_4_ = 0x7fffffff;
    auVar68._0_8_ = 0x7fffffff7fffffff;
    auVar68._12_4_ = 0x7fffffff;
    for (sVar34 = 0; children.numChildren != sVar34; sVar34 = sVar34 + 1) {
      *(undefined8 *)(uVar45 + sVar34 * 8) = *(undefined8 *)(pfVar35 + -0x15);
      fVar4 = ((BBox1f *)(pfVar35 + -1))->lower;
      fVar70 = 1.0 / (*pfVar35 - fVar4);
      fVar16 = -fVar4 * fVar70;
      auVar60 = vshufps_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),0);
      auVar52 = vshufps_avx(ZEXT416((uint)(1.0 - fVar16)),ZEXT416((uint)(1.0 - fVar16)),0);
      auVar87._0_4_ = pfVar35[-9] * auVar60._0_4_ + pfVar35[-0x11] * auVar52._0_4_;
      auVar87._4_4_ = pfVar35[-8] * auVar60._4_4_ + pfVar35[-0x10] * auVar52._4_4_;
      auVar87._8_4_ = pfVar35[-7] * auVar60._8_4_ + pfVar35[-0xf] * auVar52._8_4_;
      auVar87._12_4_ = pfVar35[-6] * auVar60._12_4_ + pfVar35[-0xe] * auVar52._12_4_;
      auVar74._0_4_ = pfVar35[-5] * auVar60._0_4_ + pfVar35[-0xd] * auVar52._0_4_;
      auVar74._4_4_ = pfVar35[-4] * auVar60._4_4_ + pfVar35[-0xc] * auVar52._4_4_;
      auVar74._8_4_ = pfVar35[-3] * auVar60._8_4_ + pfVar35[-0xb] * auVar52._8_4_;
      auVar74._12_4_ = pfVar35[-2] * auVar60._12_4_ + pfVar35[-10] * auVar52._12_4_;
      fVar70 = (1.0 - fVar4) * fVar70;
      auVar60 = vshufps_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),0);
      auVar52 = vshufps_avx(ZEXT416((uint)(1.0 - fVar70)),ZEXT416((uint)(1.0 - fVar70)),0);
      auVar77._0_4_ = pfVar35[-9] * auVar60._0_4_ + pfVar35[-0x11] * auVar52._0_4_;
      auVar77._4_4_ = pfVar35[-8] * auVar60._4_4_ + pfVar35[-0x10] * auVar52._4_4_;
      auVar77._8_4_ = pfVar35[-7] * auVar60._8_4_ + pfVar35[-0xf] * auVar52._8_4_;
      auVar77._12_4_ = pfVar35[-6] * auVar60._12_4_ + pfVar35[-0xe] * auVar52._12_4_;
      auVar71._0_4_ = pfVar35[-5] * auVar60._0_4_ + pfVar35[-0xd] * auVar52._0_4_;
      auVar71._4_4_ = pfVar35[-4] * auVar60._4_4_ + pfVar35[-0xc] * auVar52._4_4_;
      auVar71._8_4_ = pfVar35[-3] * auVar60._8_4_ + pfVar35[-0xb] * auVar52._8_4_;
      auVar71._12_4_ = pfVar35[-2] * auVar60._12_4_ + pfVar35[-10] * auVar52._12_4_;
      auVar64 = vminps_avx(auVar87,auVar61);
      auVar52 = vmaxps_avx(auVar74,auVar66);
      auVar15 = vminps_avx(auVar77,auVar61);
      auVar54 = vmaxps_avx(auVar71,auVar66);
      auVar60 = vandps_avx(auVar64,auVar68);
      auVar80._0_4_ = auVar60._0_4_ * 4.7683716e-07;
      auVar80._4_4_ = auVar60._4_4_ * 4.7683716e-07;
      auVar80._8_4_ = auVar60._8_4_ * 4.7683716e-07;
      auVar80._12_4_ = auVar60._12_4_ * 4.7683716e-07;
      auVar64 = vsubps_avx(auVar64,auVar80);
      auVar60 = vandps_avx(auVar52,auVar68);
      auVar75._0_4_ = auVar52._0_4_ + auVar60._0_4_ * 4.7683716e-07;
      auVar75._4_4_ = auVar52._4_4_ + auVar60._4_4_ * 4.7683716e-07;
      auVar75._8_4_ = auVar52._8_4_ + auVar60._8_4_ * 4.7683716e-07;
      auVar75._12_4_ = auVar52._12_4_ + auVar60._12_4_ * 4.7683716e-07;
      auVar60 = vandps_avx(auVar15,auVar68);
      auVar81._0_4_ = auVar60._0_4_ * 4.7683716e-07;
      auVar81._4_4_ = auVar60._4_4_ * 4.7683716e-07;
      auVar81._8_4_ = auVar60._8_4_ * 4.7683716e-07;
      auVar81._12_4_ = auVar60._12_4_ * 4.7683716e-07;
      auVar52 = vsubps_avx(auVar15,auVar81);
      auVar60 = vandps_avx(auVar54,auVar68);
      *(int *)(uVar45 + 0x40 + sVar34 * 4) = auVar64._0_4_;
      uVar6 = vextractps_avx(auVar64,1);
      *(undefined4 *)(uVar45 + 0x80 + sVar34 * 4) = uVar6;
      auVar72._0_4_ = auVar60._0_4_ * 4.7683716e-07 + auVar54._0_4_;
      auVar72._4_4_ = auVar60._4_4_ * 4.7683716e-07 + auVar54._4_4_;
      auVar72._8_4_ = auVar60._8_4_ * 4.7683716e-07 + auVar54._8_4_;
      auVar72._12_4_ = auVar60._12_4_ * 4.7683716e-07 + auVar54._12_4_;
      uVar6 = vextractps_avx(auVar64,2);
      *(undefined4 *)(uVar45 + 0xc0 + sVar34 * 4) = uVar6;
      *(float *)(uVar45 + 0x60 + sVar34 * 4) = auVar75._0_4_;
      uVar6 = vextractps_avx(auVar75,1);
      *(undefined4 *)(uVar45 + 0xa0 + sVar34 * 4) = uVar6;
      auVar60 = vsubps_avx(auVar52,auVar64);
      uVar6 = vextractps_avx(auVar75,2);
      *(undefined4 *)(uVar45 + 0xe0 + sVar34 * 4) = uVar6;
      *(int *)(uVar45 + 0x100 + sVar34 * 4) = auVar60._0_4_;
      uVar6 = vextractps_avx(auVar60,1);
      *(undefined4 *)(uVar45 + 0x140 + sVar34 * 4) = uVar6;
      auVar52 = vsubps_avx(auVar72,auVar75);
      uVar6 = vextractps_avx(auVar60,2);
      *(undefined4 *)(uVar45 + 0x180 + sVar34 * 4) = uVar6;
      *(int *)(uVar45 + 0x120 + sVar34 * 4) = auVar52._0_4_;
      uVar6 = vextractps_avx(auVar52,1);
      *(undefined4 *)(uVar45 + 0x160 + sVar34 * 4) = uVar6;
      uVar6 = vextractps_avx(auVar52,2);
      *(undefined4 *)(uVar45 + 0x1a0 + sVar34 * 4) = uVar6;
      pfVar35 = pfVar35 + 0x18;
    }
  }
  else {
    pfVar35 = &values[0].dt.upper;
    auVar63._8_4_ = 0x7f7fffff;
    auVar63._0_8_ = 0x7f7fffff7f7fffff;
    auVar63._12_4_ = 0x7f7fffff;
    auVar67._8_4_ = 0xff7fffff;
    auVar67._0_8_ = 0xff7fffffff7fffff;
    auVar67._12_4_ = 0xff7fffff;
    auVar69._8_4_ = 0x7fffffff;
    auVar69._0_8_ = 0x7fffffff7fffffff;
    auVar69._12_4_ = 0x7fffffff;
    auVar73._8_4_ = 0x3f800001;
    auVar73._0_8_ = 0x3f8000013f800001;
    auVar73._12_4_ = 0x3f800001;
    for (sVar34 = 0; children.numChildren != sVar34; sVar34 = sVar34 + 1) {
      *(undefined8 *)(uVar45 + sVar34 * 8) = *(undefined8 *)(pfVar35 + -0x15);
      fVar4 = *pfVar35;
      fVar16 = ((BBox1f *)(pfVar35 + -1))->lower;
      fVar76 = 1.0 / (fVar4 - fVar16);
      fVar70 = fVar76 * -fVar16;
      auVar60 = vshufps_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),0);
      auVar52 = vshufps_avx(ZEXT416((uint)(1.0 - fVar70)),ZEXT416((uint)(1.0 - fVar70)),0);
      auVar59._0_4_ = pfVar35[-9] * auVar60._0_4_ + pfVar35[-0x11] * auVar52._0_4_;
      auVar59._4_4_ = pfVar35[-8] * auVar60._4_4_ + pfVar35[-0x10] * auVar52._4_4_;
      auVar59._8_4_ = pfVar35[-7] * auVar60._8_4_ + pfVar35[-0xf] * auVar52._8_4_;
      auVar59._12_4_ = pfVar35[-6] * auVar60._12_4_ + pfVar35[-0xe] * auVar52._12_4_;
      auVar82._0_4_ = pfVar35[-5] * auVar60._0_4_ + pfVar35[-0xd] * auVar52._0_4_;
      auVar82._4_4_ = pfVar35[-4] * auVar60._4_4_ + pfVar35[-0xc] * auVar52._4_4_;
      auVar82._8_4_ = pfVar35[-3] * auVar60._8_4_ + pfVar35[-0xb] * auVar52._8_4_;
      auVar82._12_4_ = pfVar35[-2] * auVar60._12_4_ + pfVar35[-10] * auVar52._12_4_;
      fVar76 = (1.0 - fVar16) * fVar76;
      auVar60 = vshufps_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),0);
      auVar52 = vshufps_avx(ZEXT416((uint)(1.0 - fVar76)),ZEXT416((uint)(1.0 - fVar76)),0);
      auVar84._0_4_ = pfVar35[-9] * auVar60._0_4_ + pfVar35[-0x11] * auVar52._0_4_;
      auVar84._4_4_ = pfVar35[-8] * auVar60._4_4_ + pfVar35[-0x10] * auVar52._4_4_;
      auVar84._8_4_ = pfVar35[-7] * auVar60._8_4_ + pfVar35[-0xf] * auVar52._8_4_;
      auVar84._12_4_ = pfVar35[-6] * auVar60._12_4_ + pfVar35[-0xe] * auVar52._12_4_;
      auVar78._0_4_ = pfVar35[-5] * auVar60._0_4_ + pfVar35[-0xd] * auVar52._0_4_;
      auVar78._4_4_ = pfVar35[-4] * auVar60._4_4_ + pfVar35[-0xc] * auVar52._4_4_;
      auVar78._8_4_ = pfVar35[-3] * auVar60._8_4_ + pfVar35[-0xb] * auVar52._8_4_;
      auVar78._12_4_ = pfVar35[-2] * auVar60._12_4_ + pfVar35[-10] * auVar52._12_4_;
      auVar64 = vminps_avx(auVar59,auVar63);
      auVar52 = vmaxps_avx(auVar82,auVar67);
      auVar15 = vminps_avx(auVar84,auVar63);
      auVar54 = vmaxps_avx(auVar78,auVar67);
      auVar60 = vandps_avx(auVar64,auVar69);
      auVar85._0_4_ = auVar60._0_4_ * 4.7683716e-07;
      auVar85._4_4_ = auVar60._4_4_ * 4.7683716e-07;
      auVar85._8_4_ = auVar60._8_4_ * 4.7683716e-07;
      auVar85._12_4_ = auVar60._12_4_ * 4.7683716e-07;
      auVar64 = vsubps_avx(auVar64,auVar85);
      auVar60 = vandps_avx(auVar52,auVar69);
      auVar83._0_4_ = auVar52._0_4_ + auVar60._0_4_ * 4.7683716e-07;
      auVar83._4_4_ = auVar52._4_4_ + auVar60._4_4_ * 4.7683716e-07;
      auVar83._8_4_ = auVar52._8_4_ + auVar60._8_4_ * 4.7683716e-07;
      auVar83._12_4_ = auVar52._12_4_ + auVar60._12_4_ * 4.7683716e-07;
      auVar60 = vandps_avx(auVar15,auVar69);
      auVar86._0_4_ = auVar60._0_4_ * 4.7683716e-07;
      auVar86._4_4_ = auVar60._4_4_ * 4.7683716e-07;
      auVar86._8_4_ = auVar60._8_4_ * 4.7683716e-07;
      auVar86._12_4_ = auVar60._12_4_ * 4.7683716e-07;
      auVar52 = vsubps_avx(auVar15,auVar86);
      auVar60 = vandps_avx(auVar54,auVar69);
      *(int *)(uVar45 + 0x40 + sVar34 * 4) = auVar64._0_4_;
      uVar6 = vextractps_avx(auVar64,1);
      *(undefined4 *)(uVar45 + 0x80 + sVar34 * 4) = uVar6;
      auVar79._0_4_ = auVar54._0_4_ + auVar60._0_4_ * 4.7683716e-07;
      auVar79._4_4_ = auVar54._4_4_ + auVar60._4_4_ * 4.7683716e-07;
      auVar79._8_4_ = auVar54._8_4_ + auVar60._8_4_ * 4.7683716e-07;
      auVar79._12_4_ = auVar54._12_4_ + auVar60._12_4_ * 4.7683716e-07;
      uVar6 = vextractps_avx(auVar64,2);
      *(undefined4 *)(uVar45 + 0xc0 + sVar34 * 4) = uVar6;
      *(float *)(uVar45 + 0x60 + sVar34 * 4) = auVar83._0_4_;
      uVar6 = vextractps_avx(auVar83,1);
      *(undefined4 *)(uVar45 + 0xa0 + sVar34 * 4) = uVar6;
      auVar60 = vsubps_avx(auVar52,auVar64);
      uVar6 = vextractps_avx(auVar83,2);
      *(undefined4 *)(uVar45 + 0xe0 + sVar34 * 4) = uVar6;
      *(int *)(uVar45 + 0x100 + sVar34 * 4) = auVar60._0_4_;
      uVar6 = vextractps_avx(auVar60,1);
      *(undefined4 *)(uVar45 + 0x140 + sVar34 * 4) = uVar6;
      auVar52 = vsubps_avx(auVar79,auVar83);
      uVar6 = vextractps_avx(auVar60,2);
      *(undefined4 *)(uVar45 + 0x180 + sVar34 * 4) = uVar6;
      *(int *)(uVar45 + 0x120 + sVar34 * 4) = auVar52._0_4_;
      uVar6 = vextractps_avx(auVar52,1);
      *(undefined4 *)(uVar45 + 0x160 + sVar34 * 4) = uVar6;
      uVar6 = vextractps_avx(auVar52,2);
      *(undefined4 *)(uVar45 + 0x1a0 + sVar34 * 4) = uVar6;
      auVar60 = vcmpss_avx(ZEXT416((uint)fVar4),SUB6416(ZEXT464(0x3f800000),0),0);
      auVar60 = vblendvps_avx(ZEXT416((uint)fVar4),auVar73,auVar60);
      *(float *)(uVar45 + 0x1c0 + sVar34 * 4) = fVar16;
      *(int *)(uVar45 + 0x1e0 + sVar34 * 4) = auVar60._0_4_;
      pfVar35 = pfVar35 + 0x18;
    }
  }
  if ((local_1db8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (__return_storage_ptr__->ref).ptr = local_1dd8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1de8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1de8._8_8_;
    *(task_group_context **)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         local_1e18._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         uStack_1e10;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d78._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1d78._8_8_;
    uVar49 = local_1d88._0_8_;
    uVar57 = local_1d88._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    local_19a8.super_BuildRecord.depth = 0x7f8000007f800000;
    local_19a8.super_BuildRecord._8_4_ = 0x7f800000;
    local_19a8.super_BuildRecord._12_4_ = 0x7f800000;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[0] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[1] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[0] =
         INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[1] =
         INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2] =
         INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3] =
         INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2] =
         -INFINITY;
    local_19a8.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3] =
         -INFINITY;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      context_2.my_cpu_ctl_env =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      context_2.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
           (__atomic_base<unsigned_int>)
           (__atomic_base<unsigned_int>)
           (undefined4)current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      context_2.my_version =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._4_1_;
      context_2.my_traits =
           (context_traits)current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._5_1_;
      context_2.my_state.super___atomic_base<unsigned_char>._M_i =
           (__atomic_base<unsigned_char>)
           (__atomic_base<unsigned_char>)
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._6_1_;
      context_2.my_lifetime_state._M_i =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._7_1_;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&left,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&context_2);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                (&context_2,(context_traits)0x4,CUSTOM_CTX);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::InstanceArray>>(embree::avx::RecalculatePrimRef<embree::InstanceArray>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,
                 (blocked_range<unsigned_long> *)&local_19a8,(LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&context_2,local_1e18._0_8_);
      cVar25 = tbb::detail::r1::is_group_execution_cancelled(&context_2);
      if (cVar25 != '\0') {
        prVar31 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar31,"task cancelled");
        __cxa_throw(prVar31,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context(&context_2);
    }
    (__return_storage_ptr__->ref).ptr = local_1dd8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                  field_0.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[1],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[3],
                  left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                  field_0.m128[2]);
    uVar49 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[1],
                      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[0]);
    uVar57 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[3],
                      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                      field_0.m128[2]);
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = uVar49;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) = uVar57;
  BVar21.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  BVar21.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
  __return_storage_ptr__->dt = BVar21;
  for (uVar45 = 0; uVar45 < children.numChildren; uVar45 = uVar45 + 1) {
    pSVar8 = children.primvecs.items[uVar45];
    psVar1 = &pSVar8->refCount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pvVar33 = pSVar8->prims;
      if (pvVar33 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar34 = pvVar33->size_alloced;
        pPVar9 = pvVar33->items;
        if (pPVar9 != (PrimRefMB *)0x0) {
          if (sVar34 * 0x50 < 0x1c00000) {
            alignedFree(pPVar9);
          }
          else {
            os_free(pPVar9,sVar34 * 0x50,(pvVar33->alloc).hugepages);
          }
        }
        if (sVar34 != 0) {
          pMVar10 = (pvVar33->alloc).device;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar34 * -0x50,1);
        }
        pvVar33->size_active = 0;
        pvVar33->size_alloced = 0;
        pvVar33->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar33);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }